

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_ocean_shore.c
# Opt level: O2

float GeneratePinkNoise(PinkNoise *pink)

{
  PinkNoise *pPVar1;
  uint uVar2;
  
  uVar2 = pink->pink_Index + 1U & pink->pink_IndexMask;
  pink->pink_Index = uVar2;
  pPVar1 = pink;
  if (uVar2 != 0) {
    for (; (uVar2 & 1) == 0; uVar2 = (int)uVar2 >> 1) {
      pPVar1 = (PinkNoise *)(pPVar1->pink_Rows + 1);
    }
    GenerateRandomNumber_randSeed = GenerateRandomNumber_randSeed * 0xbb38435 + 0x3619636b;
    pink->pink_RunningSum =
         (pink->pink_RunningSum - pPVar1->pink_Rows[0]) + (GenerateRandomNumber_randSeed >> 0x28);
    pPVar1->pink_Rows[0] = GenerateRandomNumber_randSeed >> 0x28;
  }
  GenerateRandomNumber_randSeed = GenerateRandomNumber_randSeed * 0xbb38435 + 0x3619636b;
  return (float)((GenerateRandomNumber_randSeed >> 0x28) + pink->pink_RunningSum) *
         pink->pink_Scalar;
}

Assistant:

float GeneratePinkNoise( PinkNoise *pink )
{
    long newRandom;
    long sum;
    float output;
    /* Increment and mask index. */
    pink->pink_Index = (pink->pink_Index + 1) & pink->pink_IndexMask;
    /* If index is zero, don't update any random values. */
    if( pink->pink_Index != 0 )
    {
        /* Determine how many trailing zeros in PinkIndex. */
        /* This algorithm will hang if n==0 so test first. */
        int numZeros = 0;
        int n = pink->pink_Index;
        while( (n & 1) == 0 )
        {
            n = n >> 1;
            numZeros++;
        }
        /* Replace the indexed ROWS random value.
         * Subtract and add back to RunningSum instead of adding all the random
         * values together. Only one changes each time.
         */
        pink->pink_RunningSum -= pink->pink_Rows[numZeros];
        newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
        pink->pink_RunningSum += newRandom;
        pink->pink_Rows[numZeros] = newRandom;
    }

    /* Add extra white noise value. */
    newRandom = ((long)GenerateRandomNumber()) >> PINK_RANDOM_SHIFT;
    sum = pink->pink_RunningSum + newRandom;
    /* Scale to range of -1.0 to 0.9999. */
    output = pink->pink_Scalar * sum;
    return output;
}